

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnMemoryInitExpr
          (BinaryReaderIR *this,Index segment,Index memidx)

{
  char *pcVar1;
  Offset OVar2;
  Result RVar3;
  tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_> this_00;
  Location loc_1;
  Location loc;
  __uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_> local_170;
  Location local_168;
  Location local_148;
  Location local_128;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  local_148.field_1.field_0.line = 0;
  local_148.field_1.field_0.first_column = 0;
  local_148.field_1.field_0.last_column = 0;
  local_148.filename._M_len = 0;
  local_148.filename._M_str._0_4_ = 0;
  local_148.filename._M_str._4_4_ = 0;
  pcVar1 = this->filename_;
  local_148.filename._M_len = strlen(pcVar1);
  local_148.filename._M_str._0_4_ = SUB84(pcVar1,0);
  local_148.filename._M_str._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_148.field_1.field_0.line = (int)OVar2;
  local_148.field_1.field_0.first_column = (int)(OVar2 >> 0x20);
  Var::Var(&local_c0,segment,&local_148);
  local_168.field_1.field_0.line = 0;
  local_168.field_1.field_0.first_column = 0;
  local_168.field_1.field_0.last_column = 0;
  local_168.filename._M_len = 0;
  local_168.filename._M_str._0_4_ = 0;
  local_168.filename._M_str._4_4_ = 0;
  pcVar1 = this->filename_;
  local_168.filename._M_len = strlen(pcVar1);
  local_168.filename._M_str._0_4_ = SUB84(pcVar1,0);
  local_168.filename._M_str._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_168.field_1.field_0.line = (int)OVar2;
  local_168.field_1.field_0.first_column = (int)(OVar2 >> 0x20);
  Var::Var(&local_108,memidx,&local_168);
  this_00.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)operator_new(0xd0);
  Var::Var(&local_78,&local_108);
  local_128.field_1.field_0.line = 0;
  local_128.field_1._4_8_ = 0;
  local_128.filename._M_len = 0;
  local_128.filename._M_str._0_4_ = 0;
  local_128.filename._M_str._4_4_ = 0;
  MemoryVarExpr<(wabt::ExprType)32>::MemoryVarExpr
            ((MemoryVarExpr<(wabt::ExprType)32> *)
             this_00.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl,&local_c0,&local_78,&local_128)
  ;
  Var::~Var(&local_78);
  local_170._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       this_00.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
       super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
  RVar3 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_170);
  if ((_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
      local_170._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
    (**(code **)(*(long *)local_170._M_t.
                          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8))();
  }
  local_170._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       (_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)0x0;
  Var::~Var(&local_108);
  Var::~Var(&local_c0);
  return (Result)RVar3.enum_;
}

Assistant:

Result BinaryReaderIR::OnMemoryInitExpr(Index segment, Index memidx) {
  return AppendExpr(std::make_unique<MemoryInitExpr>(
      Var(segment, GetLocation()), Var(memidx, GetLocation())));
}